

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

void __thiscall
UTF32Test_decode_codepoint_Test::~UTF32Test_decode_codepoint_Test
          (UTF32Test_decode_codepoint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UTF32Test, decode_codepoint) {
	DECODE_CODEPOINT_TEST(U""sv, U'\0', 0U);
	DECODE_CODEPOINT_TEST(U"\0"sv, U'\0', 1U);
	DECODE_CODEPOINT_TEST(U"A"sv, U'A', 1U);
	DECODE_CODEPOINT_TEST(U"z"sv, U'z', 1U);
	DECODE_CODEPOINT_TEST(U"\u007F"sv, U'\u007F', 1U);
	DECODE_CODEPOINT_TEST(U"\u0080"sv, U'\u0080', 1U);
	DECODE_CODEPOINT_TEST(U"\u07FF"sv, U'\u07FF', 1U);
	DECODE_CODEPOINT_TEST(U"\u0800"sv, U'\u0800', 1U);
	DECODE_CODEPOINT_TEST(U"\uFFFF"sv, U'\uFFFF', 1U);
	DECODE_CODEPOINT_TEST(U"\U00010000"sv, U'\U00010000', 1U);
	DECODE_CODEPOINT_TEST(U"\U0010FFFF"sv, U'\U0010FFFF', 1U);
	DECODE_CODEPOINT_TEST(U"\U0001F604"sv, U'\U0001F604', 1U);
}